

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderApiTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::anon_unknown_0::ShaderAllocator::setSource
          (ShaderAllocator *this,ShaderType shaderType)

{
  mapped_type *ppSVar1;
  char *local_40;
  char *cSource;
  string source;
  ShaderType shaderType_local;
  ShaderAllocator *this_local;
  
  source.field_2._12_4_ = shaderType;
  (*this->m_srcGen->_vptr_SourceGenerator[2])(&cSource,this->m_srcGen,(ulong)shaderType);
  local_40 = (char *)std::__cxx11::string::c_str();
  ppSVar1 = std::
            map<glu::ShaderType,_glu::Shader_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_glu::Shader_*>_>_>
            ::operator[](&this->m_shaders,(key_type *)(source.field_2._M_local_buf + 0xc));
  glu::Shader::setSources(*ppSVar1,1,&local_40,(int *)0x0);
  std::__cxx11::string::~string((string *)&cSource);
  return;
}

Assistant:

void ShaderAllocator::setSource (const glu::ShaderType shaderType)
{
	DE_ASSERT(this->hasShader(shaderType));
	DE_ASSERT(!m_srcGen.finished(shaderType));

	const std::string	source	= m_srcGen.next(shaderType);
	const char* const	cSource	= source.c_str();

	m_shaders[shaderType]->setSources(1, &cSource, 0);
}